

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_results.hpp
# Opt level: O0

basic_resolver_results<asio::ip::tcp> *
asio::ip::basic_resolver_results<asio::ip::tcp>::create
          (addrinfo_type *address_info,string *host_name,string *service_name)

{
  string_view service;
  data_type *__dest;
  long in_RSI;
  __shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *in_RDI;
  __sv_type _Var1;
  endpoint endpoint;
  string actual_host_name;
  basic_resolver_results<asio::ip::tcp> *results;
  value_type *in_stack_fffffffffffffed8;
  basic_resolver_entry<asio::ip::tcp> *in_stack_fffffffffffffee0;
  vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
  *in_stack_fffffffffffffee8;
  __shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_resolver_entry<asio::ip::tcp> *this_00;
  char *pcVar2;
  char *in_stack_ffffffffffffff30;
  string_view in_stack_ffffffffffffff38;
  basic_resolver_entry<asio::ip::tcp> local_70;
  long local_10;
  
  local_70.service_name_._M_string_length._7_1_ = 0;
  local_10 = in_RSI;
  basic_resolver_results((basic_resolver_results<asio::ip::tcp> *)0x777ef1);
  if (local_10 == 0) {
    local_70.service_name_._M_string_length._7_1_ = 1;
    local_70.service_name_._M_string_length._0_4_ = 1;
  }
  else {
    std::__cxx11::string::string(in_stack_ffffffffffffff20,local_f0);
    if (*(long *)(local_10 + 0x20) != 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
    }
    this = in_RDI;
    operator_new(0x18);
    std::
    vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
    ::vector((vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
              *)0x777fae);
    std::
    __shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    reset<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>>
              (this,in_stack_fffffffffffffee8);
    for (; local_10 != 0; local_10 = *(long *)(local_10 + 0x28)) {
      if ((*(int *)(local_10 + 4) == 2) || (*(int *)(local_10 + 4) == 10)) {
        basic_endpoint<asio::ip::tcp>::basic_endpoint((basic_endpoint<asio::ip::tcp> *)0x778002);
        basic_endpoint<asio::ip::tcp>::resize
                  (&in_stack_fffffffffffffee0->endpoint_,(size_t)in_stack_fffffffffffffed8);
        in_stack_fffffffffffffee0 = &local_70;
        __dest = basic_endpoint<asio::ip::tcp>::data((basic_endpoint<asio::ip::tcp> *)0x77802d);
        memcpy(__dest,*(void **)(local_10 + 0x18),(ulong)*(uint *)(local_10 + 0x10));
        in_stack_fffffffffffffed8 =
             (value_type *)
             std::
             __shared_ptr_access<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x778050);
        _Var1 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffee0);
        this_00 = (basic_resolver_entry<asio::ip::tcp> *)_Var1._M_len;
        pcVar2 = _Var1._M_str;
        _Var1 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffee0);
        service._M_str = in_stack_ffffffffffffff30;
        service._M_len = (size_t)pcVar2;
        basic_resolver_entry<asio::ip::tcp>::basic_resolver_entry
                  (this_00,(endpoint_type *)_Var1._M_str,in_stack_ffffffffffffff38,service);
        std::
        vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
        ::push_back((vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                     *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        basic_resolver_entry<asio::ip::tcp>::~basic_resolver_entry(in_stack_fffffffffffffee0);
      }
    }
    local_70.service_name_._M_string_length._7_1_ = 1;
    local_70.service_name_._M_string_length._0_4_ = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffee0);
  }
  if ((local_70.service_name_._M_string_length._7_1_ & 1) == 0) {
    ~basic_resolver_results((basic_resolver_results<asio::ip::tcp> *)0x778141);
  }
  return (basic_resolver_results<asio::ip::tcp> *)in_RDI;
}

Assistant:

static basic_resolver_results create(
      asio::detail::addrinfo_type* address_info,
      const std::string& host_name, const std::string& service_name)
  {
    basic_resolver_results results;
    if (!address_info)
      return results;

    std::string actual_host_name = host_name;
    if (address_info->ai_canonname)
      actual_host_name = address_info->ai_canonname;

    results.values_.reset(new values_type);

    while (address_info)
    {
      if (address_info->ai_family == ASIO_OS_DEF(AF_INET)
          || address_info->ai_family == ASIO_OS_DEF(AF_INET6))
      {
        using namespace std; // For memcpy.
        typename InternetProtocol::endpoint endpoint;
        endpoint.resize(static_cast<std::size_t>(address_info->ai_addrlen));
        memcpy(endpoint.data(), address_info->ai_addr,
            address_info->ai_addrlen);
        results.values_->push_back(
            basic_resolver_entry<InternetProtocol>(endpoint,
              actual_host_name, service_name));
      }
      address_info = address_info->ai_next;
    }

    return results;
  }